

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

drmp3_uint64 drmp3_read_pcm_frames_f32(drmp3 *pMP3,drmp3_uint64 framesToRead,float *pBufferOut)

{
  drmp3_uint64 dVar1;
  ulong framesToRead_00;
  drmp3_uint64 dVar2;
  float temp [4096];
  
  if ((pMP3 == (drmp3 *)0x0) || (pMP3->onRead == (drmp3_read_proc)0x0)) {
    dVar1 = 0;
  }
  else if (pBufferOut == (float *)0x0) {
    dVar1 = 0;
    do {
      if (framesToRead == 0) {
        return dVar1;
      }
      framesToRead_00 = 0x1000 / (ulong)pMP3->channels;
      if (framesToRead < framesToRead_00) {
        framesToRead_00 = framesToRead;
      }
      dVar2 = drmp3_read_pcm_frames_f32(pMP3,framesToRead_00,temp);
      framesToRead = framesToRead - dVar2;
      dVar1 = dVar1 + dVar2;
    } while (dVar2 != 0);
  }
  else {
    dVar1 = drmp3_src_read_frames_ex(&pMP3->src,framesToRead,pBufferOut,1);
    pMP3->currentPCMFrame = pMP3->currentPCMFrame + dVar1;
  }
  return dVar1;
}

Assistant:

drmp3_uint64 drmp3_read_pcm_frames_f32(drmp3* pMP3, drmp3_uint64 framesToRead, float* pBufferOut)
{
    if (pMP3 == NULL || pMP3->onRead == NULL) {
        return 0;
    }

    drmp3_uint64 totalFramesRead = 0;

    if (pBufferOut == NULL) {
        float temp[4096];
        while (framesToRead > 0) {
            drmp3_uint64 framesToReadRightNow = sizeof(temp)/sizeof(temp[0]) / pMP3->channels;
            if (framesToReadRightNow > framesToRead) {
                framesToReadRightNow = framesToRead;
            }

            drmp3_uint64 framesJustRead = drmp3_read_pcm_frames_f32(pMP3, framesToReadRightNow, temp);
            if (framesJustRead == 0) {
                break;
            }

            framesToRead -= framesJustRead;
            totalFramesRead += framesJustRead;
        }
    } else {
        totalFramesRead = drmp3_src_read_frames_ex(&pMP3->src, framesToRead, pBufferOut, DRMP3_TRUE);
        pMP3->currentPCMFrame += totalFramesRead;
    }

    return totalFramesRead;
}